

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O0

bool __thiscall QGles2RenderBuffer::create(QGles2RenderBuffer *this)

{
  long lVar1;
  code *pcVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  long *in_RDI;
  long in_FS_OFFSET;
  GLenum stencilStorage;
  GLenum depthStorage;
  GLenum storage;
  QRhiGles2 *rhiD;
  GLenum gltype;
  GLenum glformat;
  GLenum glintformat;
  GLenum internalFormat;
  QSize size;
  GLenum in_stack_fffffffffffffef8;
  Flag in_stack_fffffffffffffefc;
  GLsizei in_stack_ffffffffffffff00;
  GLenum in_stack_ffffffffffffff04;
  undefined4 uVar8;
  QRhiImplementation *in_stack_ffffffffffffff08;
  QRhiGles2 *in_stack_ffffffffffffff10;
  undefined1 ownsNativeResources;
  GLenum in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  undefined8 in_stack_ffffffffffffff58;
  bool local_41;
  GLenum local_40 [4];
  undefined1 *local_30;
  char local_28 [32];
  long local_8;
  
  iVar5 = (int)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((int)in_RDI[9] != 0) {
    (**(code **)(*in_RDI + 0x18))();
  }
  lVar1 = in_RDI[1];
  iVar5 = QRhiImplementation::effectiveSampleCount
                    (&in_stack_ffffffffffffff10->super_QRhiImplementation,iVar5);
  *(int *)(in_RDI + 10) = iVar5;
  bVar4 = QFlags<QRhiRenderBuffer::Flag>::testFlag
                    ((QFlags<QRhiRenderBuffer::Flag> *)
                     CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                     in_stack_fffffffffffffefc);
  if (bVar4) {
    if ((int)in_RDI[6] == 0) {
      local_41 = true;
      goto LAB_0092cfa7;
    }
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_ffffffffffffff10,(char *)in_stack_ffffffffffffff08,
               in_stack_ffffffffffffff04,
               (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    QMessageLogger::warning
              (local_28,
               "RenderBuffer: UsedWithSwapChainOnly is meaningless in combination with Color");
  }
  bVar4 = QRhiGles2::ensureContext(in_stack_ffffffffffffff10,(QSurface *)in_stack_ffffffffffffff08);
  if (bVar4) {
    QOpenGLFunctions::glGenRenderbuffers
              ((QOpenGLFunctions *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               in_stack_fffffffffffffefc,(GLuint *)0x92c979);
    QOpenGLFunctions::glBindRenderbuffer
              ((QOpenGLFunctions *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               in_stack_fffffffffffffefc,in_stack_fffffffffffffef8);
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    bVar4 = QSize::isEmpty((QSize *)in_stack_ffffffffffffff10);
    if (bVar4) {
      QSize::QSize((QSize *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                   in_stack_fffffffffffffefc,in_stack_fffffffffffffef8);
    }
    else {
      local_30 = *(undefined1 **)((long)in_RDI + 0x34);
    }
    if ((int)in_RDI[6] == 0) {
      if (((*(uint *)(lVar1 + 0x24c) & 1) == 0) || ((int)in_RDI[10] < 2)) {
        if (((*(uint *)(lVar1 + 0x24c) >> 0xd & 1) == 0) &&
           ((*(uint *)(lVar1 + 0x24c) >> 0xe & 1) == 0)) {
          QSize::width((QSize *)0x92ccc5);
          QSize::height((QSize *)0x92ccd6);
          QOpenGLFunctions::glRenderbufferStorage
                    ((QOpenGLFunctions *)
                     CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                     in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,0,0x92ccf0);
          QOpenGLFunctions::glGenRenderbuffers
                    ((QOpenGLFunctions *)
                     CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                     in_stack_fffffffffffffefc,(GLuint *)0x92cd15);
          QOpenGLFunctions::glBindRenderbuffer
                    ((QOpenGLFunctions *)
                     CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                     in_stack_fffffffffffffefc,in_stack_fffffffffffffef8);
          QSize::width((QSize *)0x92cd65);
          QSize::height((QSize *)0x92cd76);
          QOpenGLFunctions::glRenderbufferStorage
                    ((QOpenGLFunctions *)
                     CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                     in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,0,0x92cd90);
        }
        else {
          QSize::width((QSize *)0x92cbd8);
          QSize::height((QSize *)0x92cbe9);
          QOpenGLFunctions::glRenderbufferStorage
                    ((QOpenGLFunctions *)
                     CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                     in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,0,0x92cc03);
          *(undefined4 *)((long)in_RDI + 0x4c) = 0;
        }
      }
      else {
        if ((*(ushort *)(lVar1 + 0x250) >> 8 & 1) == 0) {
          QSize::width((QSize *)0x92cb06);
          QSize::height((QSize *)0x92cb17);
          QOpenGLExtraFunctions::glRenderbufferStorageMultisample
                    ((QOpenGLExtraFunctions *)in_stack_ffffffffffffff10,
                     (GLenum)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                     (GLsizei)in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,
                     in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
        }
        else {
          pcVar2 = *(code **)(lVar1 + 0x208);
          lVar3 = in_RDI[10];
          iVar5 = QSize::width((QSize *)0x92ca9b);
          iVar6 = QSize::height((QSize *)0x92caaf);
          (*pcVar2)(0x8d41,(int)lVar3,0x88f0,iVar5,iVar6);
        }
        *(undefined4 *)((long)in_RDI + 0x4c) = 0;
      }
    }
    else if ((int)in_RDI[6] == 1) {
      local_40[3] = 0x8056;
      if (((*(uint *)(lVar1 + 0x24c) >> 0x14 & 1) != 0) &&
         (local_40[3] = 0x8058, *(int *)((long)in_RDI + 0x44) != 0)) {
        local_40[2] = 0xaaaaaaaa;
        local_40[1] = 0xaaaaaaaa;
        local_40[0] = 0xaaaaaaaa;
        toGlTextureFormat(*(Format *)((long)in_RDI + 0x44),(Caps *)(lVar1 + 0x214),local_40 + 2,
                          local_40 + 3,local_40 + 1,local_40);
      }
      if (((*(uint *)(lVar1 + 0x24c) & 1) == 0) || ((int)in_RDI[10] < 2)) {
        in_stack_ffffffffffffff10 = *(QRhiGles2 **)(lVar1 + 400);
        in_stack_ffffffffffffff18 = local_40[3];
        in_stack_ffffffffffffff1c = QSize::width((QSize *)0x92cef3);
        QSize::height((QSize *)0x92cf04);
        QOpenGLFunctions::glRenderbufferStorage
                  ((QOpenGLFunctions *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00)
                   ,in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,0,0x92cf1e);
      }
      else {
        QSize::width((QSize *)0x92ce95);
        QSize::height((QSize *)0x92cea6);
        QOpenGLExtraFunctions::glRenderbufferStorageMultisample
                  ((QOpenGLExtraFunctions *)in_stack_ffffffffffffff10,
                   (GLenum)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                   (GLsizei)in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,
                   in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
      }
    }
    ownsNativeResources = (undefined1)((ulong)in_stack_ffffffffffffff10 >> 0x38);
    if (*(long *)(lVar1 + 0x1f0) != 0) {
      in_stack_ffffffffffffff08 = *(QRhiImplementation **)(lVar1 + 0x1f0);
      uVar8 = (undefined4)in_RDI[9];
      pcVar7 = QByteArray::constData((QByteArray *)0x92cf60);
      (*(code *)in_stack_ffffffffffffff08)(0x8d41,uVar8,0xffffffff,pcVar7);
    }
    *(undefined1 *)((long)in_RDI + 0x54) = 1;
    *(int *)(in_RDI + 0xb) = (int)in_RDI[0xb] + 1;
    QRhiImplementation::registerResource
              (in_stack_ffffffffffffff08,
               (QRhiResource *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
               (bool)ownsNativeResources);
    local_41 = true;
  }
  else {
    local_41 = false;
  }
LAB_0092cfa7:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_41;
  }
  __stack_chk_fail();
}

Assistant:

bool QGles2RenderBuffer::create()
{
    if (renderbuffer)
        destroy();

    QRHI_RES_RHI(QRhiGles2);
    samples = rhiD->effectiveSampleCount(m_sampleCount);

    if (m_flags.testFlag(UsedWithSwapChainOnly)) {
        if (m_type == DepthStencil)
            return true;

        qWarning("RenderBuffer: UsedWithSwapChainOnly is meaningless in combination with Color");
    }

    if (!rhiD->ensureContext())
        return false;

    rhiD->f->glGenRenderbuffers(1, &renderbuffer);
    rhiD->f->glBindRenderbuffer(GL_RENDERBUFFER, renderbuffer);

    const QSize size = m_pixelSize.isEmpty() ? QSize(1, 1) : m_pixelSize;

    switch (m_type) {
    case QRhiRenderBuffer::DepthStencil:
        if (rhiD->caps.msaaRenderBuffer && samples > 1) {
            if (rhiD->caps.glesMultisampleRenderToTexture) {
                // Must match the logic in QGles2TextureRenderTarget::create().
                // EXT and non-EXT are not the same thing.
                rhiD->glRenderbufferStorageMultisampleEXT(GL_RENDERBUFFER, samples, GL_DEPTH24_STENCIL8,
                                                          size.width(), size.height());
            } else {
                rhiD->f->glRenderbufferStorageMultisample(GL_RENDERBUFFER, samples, GL_DEPTH24_STENCIL8,
                                                          size.width(), size.height());
            }
            stencilRenderbuffer = 0;
        } else if (rhiD->caps.packedDepthStencil || rhiD->caps.needsDepthStencilCombinedAttach) {
            const GLenum storage = rhiD->caps.needsDepthStencilCombinedAttach ? GL_DEPTH_STENCIL : GL_DEPTH24_STENCIL8;
            rhiD->f->glRenderbufferStorage(GL_RENDERBUFFER, storage,
                                           size.width(), size.height());
            stencilRenderbuffer = 0;
        } else {
            GLenum depthStorage = GL_DEPTH_COMPONENT;
            if (rhiD->caps.gles) {
                if (rhiD->caps.depth24)
                    depthStorage = GL_DEPTH_COMPONENT24;
                else
                    depthStorage = GL_DEPTH_COMPONENT16; // plain ES 2.0 only has this
            }
            const GLenum stencilStorage = rhiD->caps.gles ? GL_STENCIL_INDEX8 : GL_STENCIL_INDEX;
            rhiD->f->glRenderbufferStorage(GL_RENDERBUFFER, depthStorage,
                                           size.width(), size.height());
            rhiD->f->glGenRenderbuffers(1, &stencilRenderbuffer);
            rhiD->f->glBindRenderbuffer(GL_RENDERBUFFER, stencilRenderbuffer);
            rhiD->f->glRenderbufferStorage(GL_RENDERBUFFER, stencilStorage,
                                           size.width(), size.height());
        }
        break;
    case QRhiRenderBuffer::Color:
    {
        GLenum internalFormat = GL_RGBA4; // ES 2.0
        if (rhiD->caps.rgba8Format) {
            internalFormat = GL_RGBA8;
            if (m_backingFormatHint != QRhiTexture::UnknownFormat) {
                GLenum glintformat, glformat, gltype;
                // only care about the sized internal format, the rest is not used here
                toGlTextureFormat(m_backingFormatHint, rhiD->caps,
                                  &glintformat, &internalFormat, &glformat, &gltype);
            }
        }
        if (rhiD->caps.msaaRenderBuffer && samples > 1) {
            rhiD->f->glRenderbufferStorageMultisample(GL_RENDERBUFFER, samples, internalFormat,
                                                      size.width(), size.height());
        } else {
            rhiD->f->glRenderbufferStorage(GL_RENDERBUFFER, internalFormat,
                                           size.width(), size.height());
        }
    }
        break;
    default:
        Q_UNREACHABLE();
        break;
    }

    if (rhiD->glObjectLabel)
        rhiD->glObjectLabel(GL_RENDERBUFFER, renderbuffer, -1, m_objectName.constData());

    owns = true;
    generation += 1;
    rhiD->registerResource(this);
    return true;
}